

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

ValueType __thiscall wabt::interp::FuncDesc::GetLocalType(FuncDesc *this,Index index)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  pointer pLVar4;
  __normal_iterator<const_wabt::interp::LocalDesc_*,_std::vector<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>_>
  local_48;
  int local_3c;
  LocalDesc *local_38;
  LocalDesc *local_30;
  __normal_iterator<const_wabt::interp::LocalDesc_*,_std::vector<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>_>
  local_28;
  __normal_iterator<const_wabt::interp::LocalDesc_*,_std::vector<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>_>
  iter;
  Index index_local;
  FuncDesc *this_local;
  
  iter._M_current._4_4_ = index;
  sVar2 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(&(this->type).params);
  if (index < sVar2) {
    pvVar3 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator[]
                       (&(this->type).params,(ulong)iter._M_current._4_4_);
    this_local = *(FuncDesc **)pvVar3;
  }
  else {
    sVar2 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(&(this->type).params);
    iter._M_current._4_4_ = iter._M_current._4_4_ - (int)sVar2;
    local_30 = (LocalDesc *)
               std::vector<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>::begin
                         (&this->locals);
    local_38 = (LocalDesc *)
               std::vector<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>::end
                         (&this->locals);
    local_3c = iter._M_current._4_4_ + 1;
    local_28 = std::
               lower_bound<__gnu_cxx::__normal_iterator<wabt::interp::LocalDesc_const*,std::vector<wabt::interp::LocalDesc,std::allocator<wabt::interp::LocalDesc>>>,unsigned_int,wabt::interp::FuncDesc::GetLocalType(unsigned_int)const::__0>
                         (local_30,local_38,&local_3c);
    local_48._M_current =
         (LocalDesc *)
         std::vector<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>::end
                   (&this->locals);
    bVar1 = __gnu_cxx::operator!=(&local_28,&local_48);
    if (!bVar1) {
      __assert_fail("iter != locals.end()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/interp.cc"
                    ,0xd5,"ValueType wabt::interp::FuncDesc::GetLocalType(Index) const");
    }
    pLVar4 = __gnu_cxx::
             __normal_iterator<const_wabt::interp::LocalDesc_*,_std::vector<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>_>
             ::operator->(&local_28);
    this_local = *(FuncDesc **)&pLVar4->type;
  }
  return (ValueType)this_local;
}

Assistant:

ValueType FuncDesc::GetLocalType(Index index) const {
  if (index < type.params.size()) {
    return type.params[index];
  }
  index -= type.params.size();

  auto iter = std::lower_bound(
      locals.begin(), locals.end(), index + 1,
      [](const LocalDesc& lhs, Index rhs) { return lhs.end < rhs; });
  assert(iter != locals.end());
  return iter->type;
}